

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O3

void __thiscall
HashTable<ObjTypeGuardBucket,Memory::ArenaAllocator>::
Or<ObjTypeGuardBucket(*)(ObjTypeGuardBucket,ObjTypeGuardBucket)>
          (HashTable<ObjTypeGuardBucket,Memory::ArenaAllocator> *this,
          HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *this2,
          _func_ObjTypeGuardBucket_ObjTypeGuardBucket_ObjTypeGuardBucket *fn)

{
  int iVar1;
  SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  code *pcVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  NodeBase *pNVar6;
  Type *pTVar7;
  Type *pTVar8;
  Type *pTVar9;
  long lVar10;
  ObjTypeGuardBucket OVar11;
  JITTypeHolderBase<void> local_90;
  BVSparse<Memory::JitArenaAllocator> *local_88;
  JITTypeHolder local_80;
  ulong local_78;
  HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *local_70;
  undefined1 local_68 [8];
  EditingIterator iter;
  undefined1 local_40 [8];
  Iterator iter2;
  
  if (*(int *)(this + 8) != 0) {
    local_70 = this2;
    pNVar6 = (NodeBase *)__tls_get_addr(&PTR_01548f08);
    local_78 = 0;
    iter.last = pNVar6;
    do {
      lVar10 = local_78 * 0x10;
      iter2.list = local_70->table + local_78;
      local_40 = (undefined1  [8])iter2.list;
      if (iter2.list ==
          (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)&pNVar6->next = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar5) {
LAB_003ecd79:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *(undefined4 *)&pNVar6->next = 0;
      }
      pSVar2 = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
               ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      iter2.list = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0;
      if ((undefined1  [8])pSVar2 != local_40) {
        iter2.list = pSVar2;
      }
      local_68 = (undefined1  [8])(lVar10 + *(long *)(this + 0x10));
      iter.super_Iterator.current = (NodeBase *)0x0;
      iter.super_Iterator.list =
           (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)local_68;
      while (bVar5 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                     EditingIterator::Next((EditingIterator *)local_68), bVar5) {
        pTVar7 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator
                 ::Data((Iterator *)local_68);
        if ((undefined1  [8])iter2.list != local_40 &&
            iter2.list !=
            (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          while (iVar1 = pTVar7->value,
                pTVar8 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                         Iterator::Data((Iterator *)local_40), iVar1 < pTVar8->value) {
            pTVar8 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                     EditingIterator::InsertNodeBefore
                               ((EditingIterator *)local_68,*(ArenaAllocator **)this);
            pTVar9 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                     Iterator::Data((Iterator *)local_40);
            pTVar8->value = pTVar9->value;
            JITTypeHolderBase<void>::JITTypeHolderBase(&local_90,(JITType *)0x0);
            pTVar9 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                     Iterator::Data((Iterator *)local_40);
            auVar4._8_8_ = 0;
            auVar4._0_8_ = local_90.t;
            OVar11 = (*fn)((ObjTypeGuardBucket)(auVar4 << 0x40),pTVar9->element);
            pTVar8->element = OVar11;
            if (iter2.list ==
                (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              pNVar6 = iter.last;
              *(undefined4 *)&(iter.last)->next = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                 ,0x76,"(current != nullptr)","current != nullptr");
              if (!bVar5) goto LAB_003ecd79;
              *(undefined4 *)&pNVar6->next = 0;
            }
            pSVar2 = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                     ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
            iter2.list = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *
                         )0x0;
            if ((undefined1  [8])pSVar2 != local_40) {
              iter2.list = pSVar2;
            }
            if ((iter2.list ==
                 (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) ||
               ((undefined1  [8])iter2.list == local_40)) break;
          }
        }
        if ((iter2.list ==
             (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) ||
           ((undefined1  [8])iter2.list == local_40)) break;
        iVar1 = pTVar7->value;
        pTVar8 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator
                 ::Data((Iterator *)local_40);
        if (iVar1 == pTVar8->value) {
          OVar11 = pTVar7->element;
          pTVar8 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                   Iterator::Data((Iterator *)local_40);
          OVar11 = (*fn)(OVar11,pTVar8->element);
          pTVar7->element = OVar11;
          if (iter2.list ==
              (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            pNVar6 = iter.last;
            *(undefined4 *)&(iter.last)->next = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar5) goto LAB_003ecd79;
            *(undefined4 *)&pNVar6->next = 0;
          }
          pSVar2 = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                   ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
          iter2.list = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                       0x0;
          if ((undefined1  [8])pSVar2 != local_40) {
            iter2.list = pSVar2;
          }
        }
      }
      pNVar6 = iter.last;
      if ((iter2.list !=
           (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) &&
         ((undefined1  [8])iter2.list != local_40)) {
        do {
          pTVar7 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                   EditingIterator::InsertNodeBefore
                             ((EditingIterator *)local_68,*(ArenaAllocator **)this);
          pTVar8 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                   Iterator::Data((Iterator *)local_40);
          pTVar7->value = pTVar8->value;
          JITTypeHolderBase<void>::JITTypeHolderBase(&local_80,(JITType *)0x0);
          local_88 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
          pTVar8 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                   Iterator::Data((Iterator *)local_40);
          OVar11.monoGuardType.t = local_80.t;
          OVar11.guardedPropertyOps = local_88;
          OVar11 = (*fn)(OVar11,pTVar8->element);
          pTVar7->element = OVar11;
          if (iter2.list ==
              (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)&pNVar6->next = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar5) goto LAB_003ecd79;
            *(undefined4 *)&pNVar6->next = 0;
          }
          pSVar2 = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                   ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
          iter2.list = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                       0x0;
          if ((undefined1  [8])pSVar2 != local_40) {
            iter2.list = pSVar2;
          }
        } while ((iter2.list !=
                  (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0)
                && ((undefined1  [8])iter2.list != local_40));
      }
      local_78 = local_78 + 1;
    } while (local_78 < *(uint *)(this + 8));
  }
  return;
}

Assistant:

void Or(HashTable<T> * this2, Fn fn)
    {
        for (uint i = 0; i < this->tableSize; i++)
        {
            _TYPENAME SListBase<Bucket<T>>::Iterator iter2(&this2->table[i]);
            iter2.Next();
            FOREACH_SLISTBASE_ENTRY_EDITING(Bucket<T>, bucket, &this->table[i], iter)
            {
                while (iter2.IsValid() && bucket.value < iter2.Data().value)
                {
                    Bucket<T> * newBucket = iter.InsertNodeBefore(this->alloc);
                    newBucket->value = iter2.Data().value;
                    newBucket->element = fn(nullptr, iter2.Data().element);
                    iter2.Next();
                }

                if (!iter2.IsValid())
                {
                    break;
                }
                if (bucket.value == iter2.Data().value)
                {
                    bucket.element = fn(bucket.element, iter2.Data().element);
                    iter2.Next();
                }
            } NEXT_SLISTBASE_ENTRY_EDITING;

            while (iter2.IsValid())
            {
                Bucket<T> * newBucket = iter.InsertNodeBefore(this->alloc);
                newBucket->value = iter2.Data().value;
                newBucket->element = fn(nullptr, iter2.Data().element);
                iter2.Next();
            }
        }
    }